

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::peer_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,peer_log_alert *this)

{
  char *__rhs;
  endpoint *ep;
  string sStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  peer_alert::message_abi_cxx11_(&local_38,&this->super_peer_alert);
  std::operator+(&local_138,&local_38," [");
  print_endpoint_abi_cxx11_(&sStack_158,(libtorrent *)&(this->super_peer_alert).endpoint,ep);
  std::operator+(&local_118,&local_138,&sStack_158);
  std::operator+(&local_f8,&local_118,"] ");
  std::operator+(&local_d8,&local_f8,
                 _ZZNK10libtorrent14peer_log_alert7messageB5cxx11EvE4mode_rel +
                 *(int *)(_ZZNK10libtorrent14peer_log_alert7messageB5cxx11EvE4mode_rel +
                         (ulong)this->direction * 4));
  std::operator+(&local_b8,&local_d8," ");
  std::operator+(&local_98,&local_b8,this->event_type);
  std::operator+(&local_78,&local_98," [ ");
  __rhs = log_message(this);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(__return_storage_ptr__,&local_58," ]");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&sStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_log_alert::message() const
	{
		static char const* const mode[] =
		{ "<==", "==>", "<<<", ">>>", "***" };
		return peer_alert::message() + " [" + print_endpoint(endpoint) + "] "
			+ mode[direction] + " " + event_type + " [ " + log_message() + " ]";
	}